

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  bool bVar1;
  ulong uVar2;
  long in_RSI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  void *buffer;
  size_t capacity;
  void *local_8;
  
  if (in_RSI == 0) {
    local_8 = (void *)0x0;
  }
  else {
    uVar2 = in_RSI + 7U & 0xfffffffffffffff8;
    if ((in_RDI->chunkHead_ == (ChunkHeader *)0x0) ||
       (in_RDI->chunkHead_->capacity < in_RDI->chunkHead_->size + uVar2)) {
      capacity = uVar2;
      if (uVar2 < in_RDI->chunk_capacity_) {
        capacity = in_RDI->chunk_capacity_;
      }
      bVar1 = AddChunk(in_RDI,capacity);
      if (!bVar1) {
        return (void *)0x0;
      }
    }
    local_8 = (void *)((long)&in_RDI->chunkHead_[1].capacity + in_RDI->chunkHead_->size);
    in_RDI->chunkHead_->size = uVar2 + in_RDI->chunkHead_->size;
  }
  return local_8;
}

Assistant:

void* Malloc(size_t size) {
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (chunkHead_ == 0 || chunkHead_->size + size > chunkHead_->capacity)
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = reinterpret_cast<char *>(chunkHead_) + RAPIDJSON_ALIGN(sizeof(ChunkHeader)) + chunkHead_->size;
        chunkHead_->size += size;
        return buffer;
    }